

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_sink.c
# Opt level: O0

void lj_opt_sink(jit_State *J)

{
  uint32_t need;
  jit_State *J_local;
  
  if (((J->flags & 0x10f0000) == 0x10f0000) &&
     ((((J->chain[0x51] != 0 || (J->chain[0x52] != 0)) || (J->chain[0x53] != 0)) ||
      (J->chain[0x54] != 0)))) {
    if (J->loopref == 0) {
      sink_mark_snap(J,(J->cur).snap + (int)((J->cur).nsnap - 1));
    }
    sink_mark_ins(J);
    if (J->loopref != 0) {
      sink_remark_phi(J);
    }
    sink_sweep_ins(J);
  }
  return;
}

Assistant:

void lj_opt_sink(jit_State *J)
{
  const uint32_t need = (JIT_F_OPT_SINK|JIT_F_OPT_FWD|
			 JIT_F_OPT_DCE|JIT_F_OPT_CSE|JIT_F_OPT_FOLD);
  if ((J->flags & need) == need &&
      (J->chain[IR_TNEW] || J->chain[IR_TDUP] ||
       (LJ_HASFFI && (J->chain[IR_CNEW] || J->chain[IR_CNEWI])))) {
    if (!J->loopref)
      sink_mark_snap(J, &J->cur.snap[J->cur.nsnap-1]);
    sink_mark_ins(J);
    if (J->loopref)
      sink_remark_phi(J);
    sink_sweep_ins(J);
  }
}